

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_vad.c
# Opt level: O2

ps_vad_t * ps_vad_init(ps_vad_mode_t mode,int sample_rate,double frame_length)

{
  int iVar1;
  ps_vad_t *vad;
  
  vad = (ps_vad_t *)
        __ckd_calloc__(1,0x2f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
                       ,0x35);
  vad->refcount = 1;
  WebRtcVad_Init((VadInst *)vad);
  iVar1 = WebRtcVad_set_mode((VadInst *)vad,mode);
  if (iVar1 < 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
            ,0x39,"Invalid VAD mode %d\n",mode);
  }
  else {
    iVar1 = ps_vad_set_input_params(vad,sample_rate,frame_length);
    if (-1 < iVar1) {
      return vad;
    }
  }
  ps_vad_free(vad);
  return (ps_vad_t *)0x0;
}

Assistant:

ps_vad_t *
ps_vad_init(ps_vad_mode_t mode, int sample_rate, double frame_length)
{
    ps_vad_t *vad = ckd_calloc(1, sizeof(*vad));
    vad->refcount = 1;
    WebRtcVad_Init((VadInst *)vad);
    if (WebRtcVad_set_mode((VadInst *)vad, mode) < 0) {
        E_ERROR("Invalid VAD mode %d\n", mode);
        goto error_out;
    }
    if (ps_vad_set_input_params(vad, sample_rate, frame_length) < 0)
        goto error_out;
    return vad;
error_out:
    ps_vad_free(vad);
    return NULL;
}